

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5ExprNodeZeroPoslist(Fts5ExprNode *pNode)

{
  long lVar1;
  int *in_RDI;
  int i_1;
  Fts5ExprPhrase *pPhrase;
  int i;
  Fts5ExprNearset *pNear;
  int local_24;
  int local_14;
  Fts5ExprNode *in_stack_fffffffffffffff0;
  
  if ((*in_RDI == 9) || (*in_RDI == 4)) {
    lVar1 = *(long *)(in_RDI + 8);
    for (local_14 = 0; local_14 < *(int *)(lVar1 + 0x10); local_14 = local_14 + 1) {
      *(undefined4 *)(*(long *)(lVar1 + 0x18 + (long)local_14 * 8) + 0x10) = 0;
    }
  }
  else {
    for (local_24 = 0; local_24 < in_RDI[10]; local_24 = local_24 + 1) {
      fts5ExprNodeZeroPoslist(in_stack_fffffffffffffff0);
    }
  }
  return;
}

Assistant:

static void fts5ExprNodeZeroPoslist(Fts5ExprNode *pNode){
  if( pNode->eType==FTS5_STRING || pNode->eType==FTS5_TERM ){
    Fts5ExprNearset *pNear = pNode->pNear;
    int i;
    for(i=0; i<pNear->nPhrase; i++){
      Fts5ExprPhrase *pPhrase = pNear->apPhrase[i];
      pPhrase->poslist.n = 0;
    }
  }else{
    int i;
    for(i=0; i<pNode->nChild; i++){
      fts5ExprNodeZeroPoslist(pNode->apChild[i]);
    }
  }
}